

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetAcknowledgement *
enet_peer_queue_acknowledgement(ENetPeer *peer,ENetProtocol *command,enet_uint16 sentTime)

{
  ushort uVar1;
  ushort local_3a;
  enet_uint16 currentWindow;
  enet_uint16 reliableWindow;
  ENetChannel *channel;
  ENetAcknowledgement *acknowledgement;
  enet_uint16 sentTime_local;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  
  if ((ulong)(command->header).channelID < peer->channelCount) {
    local_3a = (command->header).reliableSequenceNumber / 0x1000;
    uVar1 = peer->channels[(command->header).channelID].incomingReliableSequenceNumber / 0x1000;
    if ((command->header).reliableSequenceNumber <
        peer->channels[(command->header).channelID].incomingReliableSequenceNumber) {
      local_3a = local_3a + 0x10;
    }
    if (((ushort)(uVar1 + 7) <= local_3a) && (local_3a <= (ushort)(uVar1 + 8))) {
      return (ENetAcknowledgement *)0x0;
    }
  }
  peer_local = (ENetPeer *)enet_malloc(0x48);
  if (peer_local == (ENetPeer *)0x0) {
    peer_local = (ENetPeer *)0x0;
  }
  else {
    peer->outgoingDataTotal = peer->outgoingDataTotal + 8;
    *(uint *)&peer_local->host = (uint)sentTime;
    memcpy((void *)((long)&peer_local->host + 4),command,0x30);
    enet_list_insert(&(peer->acknowledgements).sentinel,peer_local);
  }
  return (ENetAcknowledgement *)peer_local;
}

Assistant:

ENetAcknowledgement *enet_peer_queue_acknowledgement(ENetPeer *peer, const ENetProtocol *command, enet_uint16 sentTime) {
        ENetAcknowledgement *acknowledgement;

        if (command->header.channelID < peer->channelCount) {
            ENetChannel *channel       = &peer->channels[command->header.channelID];
            enet_uint16 reliableWindow = command->header.reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
            enet_uint16 currentWindow  = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

            if (command->header.reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
            }

            if (reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1 && reliableWindow <= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS) {
                return NULL;
            }
        }

        acknowledgement = (ENetAcknowledgement *) enet_malloc(sizeof(ENetAcknowledgement));
        if (acknowledgement == NULL) {
            return NULL;
        }

        peer->outgoingDataTotal += sizeof(ENetProtocolAcknowledge);

        acknowledgement->sentTime = sentTime;
        acknowledgement->command  = *command;

        enet_list_insert(enet_list_end(&peer->acknowledgements), acknowledgement);
        return acknowledgement;
    }